

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbcs.c
# Opt level: O3

void write_sbcs(charset_spec *charset,long input_chr,charset_state *state,
               _func_void_void_ptr_long *emit,void *emitctx)

{
  void *pvVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  pvVar1 = charset->data;
  uVar5 = *(uint *)((long)pvVar1 + 0x900);
  if (0 < (int)uVar5) {
    uVar7 = 0xffffffff;
    do {
      uVar6 = uVar7 + uVar5 >> 1;
      uVar4 = (ulong)*(byte *)((long)pvVar1 + (ulong)uVar6 + 0x800);
      uVar2 = *(ulong *)((long)pvVar1 + uVar4 * 8);
      uVar3 = uVar6;
      if ((uVar2 <= (ulong)input_chr) && (uVar3 = uVar5, uVar7 = uVar6, (ulong)input_chr <= uVar2))
      goto LAB_00115ecd;
      uVar5 = uVar3;
    } while ((int)(uVar7 + 1) < (int)uVar5);
  }
  uVar4 = 0xffff;
LAB_00115ecd:
  (*emit)(emitctx,uVar4);
  return;
}

Assistant:

void write_sbcs(charset_spec const *charset, long int input_chr,
                charset_state *state,
                void (*emit)(void *ctx, long int output), void *emitctx)
{
    const struct sbcs_data *sd = charset->data;
    int i, j, k, c;

    UNUSEDARG(state);

    /*
     * Binary-search in the ucs2sbcs table.
     */
    i = -1;
    j = sd->nvalid;
    while (i+1 < j) {
        k = (i+j)/2;
        c = sd->ucs2sbcs[k];
        if (input_chr < sd->sbcs2ucs[c])
            j = k;
        else if (input_chr > sd->sbcs2ucs[c])
            i = k;
        else {
            emit(emitctx, c);
            return;
        }
    }
    emit(emitctx, ERROR);
}